

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

int tcu::astc::anon_unknown_0::computeTexelPartition
              (deUint32 seedIn,deUint32 xIn,deUint32 yIn,deUint32 zIn,int numPartitions,
              bool smallBlock)

{
  byte bVar1;
  sbyte sVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  sbyte sVar13;
  sbyte sVar14;
  deUint32 v;
  deUint32 dVar15;
  uint uVar16;
  uint uVar17;
  int local_8c;
  int local_88;
  uint local_84;
  uint local_80;
  deUint32 local_70;
  int d;
  int c;
  int b;
  int a;
  int sh3;
  int sh2;
  int sh1;
  int shB;
  int shA;
  deUint8 seed12;
  deUint8 seed11;
  deUint8 seed10;
  deUint8 seed9;
  deUint8 seed8;
  deUint8 seed7;
  deUint8 seed6;
  deUint8 seed5;
  deUint8 seed4;
  deUint8 seed3;
  deUint8 seed2;
  deUint8 seed1;
  deUint32 rnum;
  deUint32 seed;
  deUint32 z;
  deUint32 y;
  deUint32 x;
  bool smallBlock_local;
  int numPartitions_local;
  deUint32 zIn_local;
  deUint32 yIn_local;
  deUint32 xIn_local;
  deUint32 seedIn_local;
  
  local_70 = zIn;
  if (smallBlock) {
    xIn = xIn << 1;
    yIn = yIn << 1;
    local_70 = zIn << 1;
  }
  v = seedIn + (numPartitions + -1) * 0x400;
  dVar15 = hash52(v);
  bVar3 = (byte)dVar15 & 0xf;
  bVar4 = (byte)(dVar15 >> 4) & 0xf;
  bVar5 = (byte)(dVar15 >> 8) & 0xf;
  bVar6 = (byte)(dVar15 >> 0xc) & 0xf;
  bVar7 = (byte)(dVar15 >> 0x10) & 0xf;
  bVar8 = (byte)(dVar15 >> 0x14) & 0xf;
  bVar1 = (byte)(dVar15 >> 0x18);
  bVar9 = (byte)(dVar15 >> 0x12) & 0xf;
  bVar10 = (byte)(dVar15 >> 0x16) & 0xf;
  bVar11 = bVar1 >> 2 & 0xf;
  bVar12 = bVar1 >> 6 | (byte)(dVar15 << 2) & 0xf;
  sVar13 = 5;
  if ((v & 2) != 0) {
    sVar13 = 4;
  }
  sVar14 = 5;
  if (numPartitions == 3) {
    sVar14 = 6;
  }
  sVar2 = sVar14;
  if ((v & 1) != 0) {
    sVar2 = sVar13;
  }
  if ((v & 1) != 0) {
    sVar13 = sVar14;
  }
  sVar14 = sVar13;
  if ((v & 0x10) != 0) {
    sVar14 = sVar2;
  }
  uVar16 = ((int)(uint)(byte)(bVar3 * bVar3) >> sVar2 & 0xffU) * xIn +
           ((int)(uint)(byte)(bVar4 * bVar4) >> sVar13 & 0xffU) * yIn +
           ((int)(uint)(byte)(bVar11 * bVar11) >> sVar14 & 0xffU) * local_70 + (dVar15 >> 0xe) &
           0x3f;
  uVar17 = ((int)(uint)(byte)(bVar5 * bVar5) >> sVar2 & 0xffU) * xIn +
           ((int)(uint)(byte)(bVar6 * bVar6) >> sVar13 & 0xffU) * yIn +
           ((int)(uint)(byte)(bVar12 * bVar12) >> sVar14 & 0xffU) * local_70 + (dVar15 >> 10) & 0x3f
  ;
  if (numPartitions < 3) {
    local_80 = 0;
  }
  else {
    local_80 = ((int)(uint)(byte)(bVar7 * bVar7) >> sVar2 & 0xffU) * xIn +
               ((int)(uint)(byte)(bVar8 * bVar8) >> sVar13 & 0xffU) * yIn +
               ((int)(uint)(byte)(bVar9 * bVar9) >> sVar14 & 0xffU) * local_70 + (dVar15 >> 6) &
               0x3f;
  }
  if (numPartitions < 4) {
    local_84 = 0;
  }
  else {
    local_84 = ((int)(uint)(byte)((bVar1 & 0xf) * (bVar1 & 0xf)) >> sVar2 & 0xffU) * xIn +
               ((int)(uint)(byte)((bVar1 >> 4) * (bVar1 >> 4)) >> sVar13 & 0xffU) * yIn +
               ((int)(uint)(byte)(bVar10 * bVar10) >> sVar14 & 0xffU) * local_70 + (dVar15 >> 2) &
               0x3f;
  }
  if (((uVar16 < uVar17) || (uVar16 < local_80)) || (uVar16 < local_84)) {
    if ((uVar17 < local_80) || (uVar17 < local_84)) {
      local_8c = 3;
      if (local_84 <= local_80) {
        local_8c = 2;
      }
    }
    else {
      local_8c = 1;
    }
    local_88 = local_8c;
  }
  else {
    local_88 = 0;
  }
  return local_88;
}

Assistant:

int computeTexelPartition (deUint32 seedIn, deUint32 xIn, deUint32 yIn, deUint32 zIn, int numPartitions, bool smallBlock)
{
	DE_ASSERT(zIn == 0);
	const deUint32	x		= smallBlock ? xIn << 1 : xIn;
	const deUint32	y		= smallBlock ? yIn << 1 : yIn;
	const deUint32	z		= smallBlock ? zIn << 1 : zIn;
	const deUint32	seed	= seedIn + 1024*(numPartitions-1);
	const deUint32	rnum	= hash52(seed);
	deUint8			seed1	= (deUint8)( rnum							& 0xf);
	deUint8			seed2	= (deUint8)((rnum >>  4)					& 0xf);
	deUint8			seed3	= (deUint8)((rnum >>  8)					& 0xf);
	deUint8			seed4	= (deUint8)((rnum >> 12)					& 0xf);
	deUint8			seed5	= (deUint8)((rnum >> 16)					& 0xf);
	deUint8			seed6	= (deUint8)((rnum >> 20)					& 0xf);
	deUint8			seed7	= (deUint8)((rnum >> 24)					& 0xf);
	deUint8			seed8	= (deUint8)((rnum >> 28)					& 0xf);
	deUint8			seed9	= (deUint8)((rnum >> 18)					& 0xf);
	deUint8			seed10	= (deUint8)((rnum >> 22)					& 0xf);
	deUint8			seed11	= (deUint8)((rnum >> 26)					& 0xf);
	deUint8			seed12	= (deUint8)(((rnum >> 30) | (rnum << 2))	& 0xf);

	seed1  = (deUint8)(seed1  * seed1 );
	seed2  = (deUint8)(seed2  * seed2 );
	seed3  = (deUint8)(seed3  * seed3 );
	seed4  = (deUint8)(seed4  * seed4 );
	seed5  = (deUint8)(seed5  * seed5 );
	seed6  = (deUint8)(seed6  * seed6 );
	seed7  = (deUint8)(seed7  * seed7 );
	seed8  = (deUint8)(seed8  * seed8 );
	seed9  = (deUint8)(seed9  * seed9 );
	seed10 = (deUint8)(seed10 * seed10);
	seed11 = (deUint8)(seed11 * seed11);
	seed12 = (deUint8)(seed12 * seed12);

	const int shA = (seed & 2) != 0		? 4		: 5;
	const int shB = numPartitions == 3	? 6		: 5;
	const int sh1 = (seed & 1) != 0		? shA	: shB;
	const int sh2 = (seed & 1) != 0		? shB	: shA;
	const int sh3 = (seed & 0x10) != 0	? sh1	: sh2;

	seed1  = (deUint8)(seed1  >> sh1);
	seed2  = (deUint8)(seed2  >> sh2);
	seed3  = (deUint8)(seed3  >> sh1);
	seed4  = (deUint8)(seed4  >> sh2);
	seed5  = (deUint8)(seed5  >> sh1);
	seed6  = (deUint8)(seed6  >> sh2);
	seed7  = (deUint8)(seed7  >> sh1);
	seed8  = (deUint8)(seed8  >> sh2);
	seed9  = (deUint8)(seed9  >> sh3);
	seed10 = (deUint8)(seed10 >> sh3);
	seed11 = (deUint8)(seed11 >> sh3);
	seed12 = (deUint8)(seed12 >> sh3);

	const int a =						0x3f & (seed1*x + seed2*y + seed11*z + (rnum >> 14));
	const int b =						0x3f & (seed3*x + seed4*y + seed12*z + (rnum >> 10));
	const int c = numPartitions >= 3 ?	0x3f & (seed5*x + seed6*y + seed9*z  + (rnum >>  6))	: 0;
	const int d = numPartitions >= 4 ?	0x3f & (seed7*x + seed8*y + seed10*z + (rnum >>  2))	: 0;

	return a >= b && a >= c && a >= d	? 0
		 : b >= c && b >= d				? 1
		 : c >= d						? 2
		 :								  3;
}